

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

void key_callback(GLFWwindow *self,int key,int scancode,int action,int mods)

{
  bov_window_t *window_00;
  bov_window_t *window;
  char screenshot_name [64];
  int mods_local;
  int action_local;
  int scancode_local;
  int key_local;
  GLFWwindow *self_local;
  
  memcpy(&window,"screenshot",0x40);
  window_00 = (bov_window_t *)glfwGetWindowUserPointer(self);
  if ((action == 1) || (action == 2)) {
    if (key == 0x20) {
      if (window_00->running == 0) {
        window_00->running = 1;
      }
      else {
        window_00->running = 0;
      }
    }
    else if ((key == 0x48) || (key == 0x4b)) {
      if (window_00->help_needed == 0) {
        window_00->help_needed = 1;
      }
      else {
        window_00->help_needed = 0;
      }
    }
    else if (key == 0x50) {
      key_callback::screenshot_nbr = key_callback::screenshot_nbr + 1;
      snprintf(screenshot_name + 2,0x36,"%u.ppm");
      bov_window_screenshot(window_00,(char *)&window);
    }
    else if (key == 0x52) {
      (window_00->param).zoom = 1.0;
      (window_00->param).translate[0] = 0.0;
      (window_00->param).translate[1] = 0.0;
    }
    else if (key == 0x100) {
      glfwSetWindowShouldClose(self,1);
    }
    else if (key == 0x108) {
      window_00->counter = window_00->counter - 1;
    }
    else if (key == 0x109) {
      window_00->counter = window_00->counter + 1;
    }
  }
  if (key == 0x100) {
    glfwSetWindowShouldClose(self,1);
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* self,
                         int key, int scancode, int action,int mods)
{
	static unsigned screenshot_nbr = 0;
	char screenshot_name[64] = "screenshot";
	bov_window_t* window = (bov_window_t*) glfwGetWindowUserPointer(self);
	if(action==GLFW_PRESS || action==GLFW_REPEAT) {
		switch(key) {
			case GLFW_KEY_ESCAPE:
				glfwSetWindowShouldClose(self,GL_TRUE);
				break;
			case GLFW_KEY_SPACE:
				if(window->running==0) {
					window->running = 1;
				}
				else {
					window->running = 0;
				}
				break;
			case GLFW_KEY_H:
			case GLFW_KEY_K:
				if(window->help_needed==0) {
					window->help_needed = 1;
				}
				else {
					window->help_needed = 0;
				}
				break;
			case GLFW_KEY_P:
				snprintf(screenshot_name + 10, 54, "%u.ppm", screenshot_nbr++);
				bov_window_screenshot(window, screenshot_name);
				break;
			case GLFW_KEY_R:
				window->param.zoom = 1.0f;
				window->param.translate[0] = 0.0f;
				window->param.translate[1] = 0.0f;
				break;
			case GLFW_KEY_UP:
				window->counter++;
				break;
			case GLFW_KEY_DOWN:
				window->counter--;
				break;
		}
	}
	if(key==GLFW_KEY_ESCAPE)
		glfwSetWindowShouldClose(self,GL_TRUE);
}